

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::TextureVkImpl::CreateStagingTexture
          (TextureVkImpl *this,TextureData *pInitData,TextureFormatAttribs *FmtAttribs)

{
  TextureDesc *pTVar1;
  RESOURCE_DIMENSION RVar2;
  CPU_ACCESS_FLAGS CVar3;
  VulkanLogicalDevice *this_00;
  VkDeviceSize VVar4;
  VkDeviceMemory memory;
  TextureSubResData *pTVar5;
  VkResult errorCode;
  uint uVar6;
  undefined8 in_RAX;
  RenderDeviceVkImpl *pRVar7;
  uint8_t *puVar8;
  Uint64 UVar9;
  uint uVar10;
  Uint32 layer;
  Uint32 UVar11;
  ulong memoryOffset;
  VkMemoryPropertyFlags MemoryProps;
  char (*Args_2) [23];
  char *Args_2_00;
  int iVar12;
  Uint32 UVar13;
  string msg;
  string StagingBufferName;
  VkBufferCreateInfo VkStagingBuffCI;
  VkMemoryRequirements StagingBufferMemReqs;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  Uint64 local_d8;
  undefined8 local_c8;
  long *local_c0 [2];
  long local_b0 [2];
  ulong local_a0;
  VkBufferCreateInfo local_98;
  TextureFormatAttribs *local_60;
  TextureDesc *local_58;
  TextureData *local_50;
  VkMemoryRequirements local_48;
  
  if ((pInitData == (TextureData *)0x0) || (pInitData->pSubResources == (TextureSubResData *)0x0)) {
    local_c8 = 0;
  }
  else {
    local_c8 = CONCAT71((int7)((ulong)in_RAX >> 8),pInitData->NumSubresources != 0);
  }
  local_60 = FmtAttribs;
  pRVar7 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  this_00 = (pRVar7->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_98.size = 0;
  local_98.pQueueFamilyIndices = (uint32_t *)0x0;
  local_98.usage = 0;
  local_98.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_98.queueFamilyIndexCount = 0;
  local_98._44_4_ = 0;
  local_98.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.pNext = (void *)0x0;
  local_98.flags = 0;
  local_98._20_4_ = 0;
  RVar2 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Type;
  pTVar1 = &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc;
  UVar11 = 1;
  if ((0x1a8U >> (RVar2 & 0x1f) & 1) != 0) {
    UVar11 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc.field_3.ArraySize;
  }
  UVar13 = 1;
  if (RVar2 < RESOURCE_DIM_NUM_DIMENSIONS) {
    UVar13 = UVar11;
  }
  Args_2 = (char (*) [23])0x0;
  local_98.size = GetStagingTextureLocationOffset(pTVar1,UVar13,0,0x10,0,0,0);
  if (1 < (byte)(((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc.CPUAccessFlags & (CPU_ACCESS_FLAG_LAST|CPU_ACCESS_READ)) - CPU_ACCESS_READ
                )) {
    FormatString<char[75]>
              ((string *)local_f8,
               (char (*) [75])
               "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    DebugAssertionFailed
              ((Char *)local_f8,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x256);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
    }
  }
  CVar3 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.CPUAccessFlags;
  if ((CVar3 & CPU_ACCESS_READ) == CPU_ACCESS_NONE) {
    if ((CVar3 & CPU_ACCESS_FLAG_LAST) == CPU_ACCESS_NONE) {
      FormatString<char[22]>((string *)local_f8,(char (*) [22])"Unexpected CPU access");
      DebugAssertionFailed
                ((Char *)local_f8,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x271);
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      MemoryProps = 2;
    }
    else {
      local_98.usage = 1;
      (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_COPY_SOURCE;
      MemoryProps = 6;
    }
  }
  else {
    if ((char)local_c8 != '\0') {
      FormatString<char[54]>
                ((string *)local_f8,
                 (char (*) [54])"Readback textures should not be initialized with data");
      DebugAssertionFailed
                ((Char *)local_f8,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x25b);
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
    }
    local_98.usage = 2;
    (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_COPY_DEST;
    pRVar7 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)this);
    VVar4 = local_98.size;
    local_c0[0] = *(long **)((long)&(((pRVar7->m_PhysicalDevice)._M_t.
                                      super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                                      .
                                      super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>
                                     ._M_head_impl)->m_Properties).limits + 0x1f0);
    if (((ulong)local_c0[0] ^ (long)local_c0[0] - 1U) <= (long)local_c0[0] - 1U) {
      FormatString<char[12],unsigned_long,char[23]>
                ((string *)local_f8,(Diligent *)"Alignment (",(char (*) [12])local_c0,
                 (unsigned_long *)") must be a power of 2",Args_2);
      DebugAssertionFailed
                ((Char *)local_f8,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
    }
    local_98.size = -(long)local_c0[0] & (long)local_c0[0] + (VVar4 - 1);
    MemoryProps = 10;
  }
  local_98.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_98.queueFamilyIndexCount = 0;
  local_98.pQueueFamilyIndices = (uint32_t *)0x0;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Staging buffer for \'","");
  std::__cxx11::string::append((char *)local_c0);
  std::__cxx11::string::push_back((char)local_c0);
  local_50 = pInitData;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)local_f8,this_00,&local_98,(char *)local_c0[0]);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_StagingBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_f8);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_f8);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&local_48,this_00,(this->m_StagingBuffer).m_VkObject);
  if ((local_48.alignment ^ local_48.alignment - 1) <= local_48.alignment - 1) {
    FormatString<char[29]>((string *)local_f8,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)local_f8,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x27d);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
    }
  }
  pRVar7 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  Args_2_00 = (char *)0x0;
  VulkanUtilities::VulkanMemoryManager::Allocate
            ((VulkanMemoryAllocation *)local_f8,&pRVar7->m_MemoryMgr,&local_48,MemoryProps,0);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)local_f8;
  (this->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)_Stack_f0._M_pi;
  (this->m_MemoryAllocation).Size = local_e8._M_allocated_capacity;
  local_f8 = (undefined1  [8])0x0;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8._M_allocated_capacity = 0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)local_f8);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    Args_2_00 = "Failed to allocate memory for staging texture \'";
    LogError<true,char[48],char_const*,char[3]>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x281,(char (*) [48])"Failed to allocate memory for staging texture \'",
               (char **)pTVar1,(char (*) [3])"\'.");
  }
  VVar4 = (this->m_MemoryAllocation).UnalignedOffset;
  memory = (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject;
  local_a0 = local_48.alignment;
  local_58 = pTVar1;
  if ((local_48.alignment ^ local_48.alignment - 1) <= local_48.alignment - 1) {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)local_f8,(Diligent *)"Alignment (",(char (*) [12])&local_a0,
               (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2_00);
    DebugAssertionFailed
              ((Char *)local_f8,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
    }
  }
  memoryOffset = -local_a0 & (VVar4 + local_a0) - 1;
  if ((this->m_MemoryAllocation).Size <
      (local_48.size + memoryOffset) - (this->m_MemoryAllocation).UnalignedOffset) {
    FormatString<char[26],char[118]>
              ((string *)local_f8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset)"
               ,(char (*) [118])this);
    DebugAssertionFailed
              ((Char *)local_f8,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x285);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
    }
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_00,(this->m_StagingBuffer).m_VkObject,memory,memoryOffset);
  if (errorCode != VK_SUCCESS) {
    local_f8 = (undefined1  [8])VulkanUtilities::VkResultToString(errorCode);
    LogError<true,char[37],char[17],char_const*>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x288,(char (*) [37])"Failed to bind staging buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)local_f8);
  }
  this->m_StagingDataAlignedOffset = memoryOffset;
  if ((char)local_c8 != '\0') {
    puVar8 = GetStagingDataCPUAddress(this);
    pTVar1 = local_58;
    iVar12 = 0;
    UVar11 = 0;
    while( true ) {
      RVar2 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              .m_Desc.Type;
      uVar10 = 1;
      if ((0x1a8U >> (RVar2 & 0x1f) & 1) != 0) {
        uVar10 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                 .m_Desc.field_3.ArraySize;
      }
      uVar6 = 1;
      if (RVar2 < RESOURCE_DIM_NUM_DIMENSIONS) {
        uVar6 = uVar10;
      }
      if (uVar6 <= UVar11) break;
      if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.MipLevels != 0) {
        UVar13 = 0;
        do {
          pTVar5 = local_50->pSubResources;
          GetMipLevelProperties((MipLevelProperties *)local_f8,pTVar1,UVar13);
          UVar9 = GetStagingTextureLocationOffset(pTVar1,UVar11,UVar13,0x10,0,0,0);
          CopyTextureSubresource
                    (pTVar5 + (iVar12 + UVar13),_Stack_f0._M_pi._4_4_ / local_60->BlockHeight,
                     local_e8._M_allocated_capacity._0_4_,local_e8._8_8_,puVar8 + UVar9,
                     local_e8._8_8_,local_d8);
          UVar13 = UVar13 + 1;
        } while (UVar13 < (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          .m_Desc.MipLevels);
        iVar12 = iVar12 + UVar13;
      }
      UVar11 = UVar11 + 1;
    }
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return;
}

Assistant:

void TextureVkImpl::CreateStagingTexture(const TextureData* pInitData, const TextureFormatAttribs& FmtAttribs)
{
    const bool                                  bInitializeTexture = (pInitData != nullptr && pInitData->pSubResources != nullptr && pInitData->NumSubresources > 0);
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice      = GetDevice()->GetLogicalDevice();

    VkBufferCreateInfo VkStagingBuffCI = {};

    VkStagingBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkStagingBuffCI.pNext = nullptr;
    VkStagingBuffCI.flags = 0;
    VkStagingBuffCI.size  = GetStagingTextureDataSize(m_Desc, StagingBufferOffsetAlignment);

    // clang-format off
        DEV_CHECK_ERR((m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_READ ||
                      (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_WRITE,
                      "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    // clang-format on
    VkMemoryPropertyFlags MemProperties = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;
    if (m_Desc.CPUAccessFlags & CPU_ACCESS_READ)
    {
        DEV_CHECK_ERR(!bInitializeTexture, "Readback textures should not be initialized with data");

        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_DST_BIT;
        MemProperties |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;
        SetState(RESOURCE_STATE_COPY_DEST);

        // We do not set HOST_COHERENT bit, so we will have to use InvalidateMappedMemoryRanges,
        // which requires the ranges to be aligned by nonCoherentAtomSize.
        const VkPhysicalDeviceLimits& DeviceLimits = GetDevice()->GetPhysicalDevice().GetProperties().limits;
        // Align the buffer size to ensure that any aligned range is always in bounds.
        VkStagingBuffCI.size = AlignUp(VkStagingBuffCI.size, DeviceLimits.nonCoherentAtomSize);
    }
    else if (m_Desc.CPUAccessFlags & CPU_ACCESS_WRITE)
    {
        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
        // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
        // to the host (10.2)
        MemProperties |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
        SetState(RESOURCE_STATE_COPY_SOURCE);
    }
    else
        UNEXPECTED("Unexpected CPU access");

    VkStagingBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    VkStagingBuffCI.queueFamilyIndexCount = 0;
    VkStagingBuffCI.pQueueFamilyIndices   = nullptr;

    std::string StagingBufferName = "Staging buffer for '";
    StagingBufferName += m_Desc.Name;
    StagingBufferName += '\'';
    m_StagingBuffer = LogicalDevice.CreateBuffer(VkStagingBuffCI, StagingBufferName.c_str());

    VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(m_StagingBuffer);
    VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

    m_MemoryAllocation = GetDevice()->AllocateMemory(StagingBufferMemReqs, MemProperties);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for staging texture '", m_Desc.Name, "'.");

    VkDeviceMemory StagingBufferMemory     = m_MemoryAllocation.Page->GetVkMemory();
    VkDeviceSize   AlignedStagingMemOffset = AlignUp(m_MemoryAllocation.UnalignedOffset, StagingBufferMemReqs.alignment);
    VERIFY_EXPR(m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset));

    VkResult err = LogicalDevice.BindBufferMemory(m_StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

    m_StagingDataAlignedOffset = AlignedStagingMemOffset;

    if (bInitializeTexture)
    {
        uint8_t* const pStagingData = GetStagingDataCPUAddress();

        Uint32 subres = 0;
        for (Uint32 layer = 0; layer < m_Desc.GetArraySize(); ++layer)
        {
            for (Uint32 mip = 0; mip < m_Desc.MipLevels; ++mip)
            {
                const TextureSubResData& SubResData = pInitData->pSubResources[subres++];
                const MipLevelProperties MipProps   = GetMipLevelProperties(m_Desc, mip);

                const Uint64 DstSubresOffset =
                    GetStagingTextureSubresourceOffset(m_Desc, layer, mip, StagingBufferOffsetAlignment);

                CopyTextureSubresource(SubResData,
                                       MipProps.StorageHeight / FmtAttribs.BlockHeight, // NumRows
                                       MipProps.Depth,
                                       MipProps.RowSize,
                                       pStagingData + DstSubresOffset,
                                       MipProps.RowSize,       // DstRowStride
                                       MipProps.DepthSliceSize // DstDepthStride
                );
            }
        }
    }
}